

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_getfenv(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  
  if (((*J->base & 0x1f008000) == 0x13000000) && ((J->cur).ir[*J->base & 0x7fff].field_1.op12 == 0))
  {
    (J->fold).ins.field_0.ot = 0x4006;
    (J->fold).ins.field_1.op12 = 0;
    TVar1 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x440b0004;
    TVar1 = lj_opt_fold(J);
    *J->base = TVar1;
    return;
  }
  recff_nyi(J,rd);
  return;
}

Assistant:

static void LJ_FASTCALL recff_getfenv(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  /* Only support getfenv(0) for now. */
  if (tref_isint(tr) && tref_isk(tr) && IR(tref_ref(tr))->i == 0) {
    TRef trl = emitir(IRT(IR_LREF, IRT_THREAD), 0, 0);
    J->base[0] = emitir(IRT(IR_FLOAD, IRT_TAB), trl, IRFL_THREAD_ENV);
    return;
  }
  recff_nyiu(J, rd);
}